

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

void __thiscall
kj::Vector<capnp::Orphan<capnp::json::Value>_>::~Vector
          (Vector<capnp::Orphan<capnp::json::Value>_> *this)

{
  Orphan<capnp::json::Value> *pOVar1;
  RemoveConst<capnp::Orphan<capnp::json::Value>_> *pRVar2;
  Orphan<capnp::json::Value> *pOVar3;
  ArrayDisposer *pAVar4;
  
  pOVar1 = (this->builder).ptr;
  if (pOVar1 != (Orphan<capnp::json::Value> *)0x0) {
    pRVar2 = (this->builder).pos;
    pOVar3 = (this->builder).endPtr;
    (this->builder).ptr = (Orphan<capnp::json::Value> *)0x0;
    (this->builder).pos = (RemoveConst<capnp::Orphan<capnp::json::Value>_> *)0x0;
    (this->builder).endPtr = (Orphan<capnp::json::Value> *)0x0;
    pAVar4 = (this->builder).disposer;
    (**pAVar4->_vptr_ArrayDisposer)
              (pAVar4,pOVar1,0x20,(long)pRVar2 - (long)pOVar1 >> 5,(long)pOVar3 - (long)pOVar1 >> 5,
               ArrayDisposer::Dispose_<capnp::Orphan<capnp::json::Value>_>::destruct);
    return;
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    T* posCopy = pos;
    T* endCopy = endPtr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      pos = nullptr;
      endPtr = nullptr;
      disposer->dispose(ptrCopy, posCopy - ptrCopy, endCopy - ptrCopy);
    }
  }